

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarCase::initPrograms
          (ComputeBuiltinVarCase *this,SourceCollections *programCollection)

{
  DataType varType;
  SubCase *pSVar1;
  const_reference this_00;
  ostream *this_01;
  ProgramSources *this_02;
  UVec3 *localSize;
  char *__s;
  allocator<char> local_239;
  string local_238;
  string local_218;
  ShaderSource local_1f8;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream name;
  SubCase *subCase;
  size_t i;
  SourceCollections *programCollection_local;
  ComputeBuiltinVarCase *this_local;
  
  subCase = (SubCase *)0x0;
  while( true ) {
    pSVar1 = (SubCase *)
             std::
             vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
             ::size(&this->m_subCases);
    if (pSVar1 <= subCase) break;
    this_00 = std::
              vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
              ::operator[](&this->m_subCases,(size_type)subCase);
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    this_01 = std::operator<<((ostream *)local_1a0,
                              (string *)
                              compute::(anonymous_namespace)::s_prefixProgramName_abi_cxx11_);
    std::ostream::operator<<(this_01,(ulong)subCase);
    std::__cxx11::ostringstream::str();
    this_02 = ::vk::ProgramCollection<glu::ProgramSources>::add
                        (&programCollection->glslSources,&local_1d0);
    varType = this->m_varType;
    localSize = SubCase::localSize(this_00);
    genBuiltinVarSource(&local_238,this,&this->m_varName,varType,localSize);
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,__s,&local_239);
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_1f8,&local_218);
    glu::ProgramSources::operator<<(this_02,&local_1f8);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    subCase = (SubCase *)((long)(subCase->m_localSize).m_data + 1);
  }
  return;
}

Assistant:

void ComputeBuiltinVarCase::initPrograms (SourceCollections& programCollection) const
{
	for (std::size_t i = 0; i < m_subCases.size(); i++)
	{
		const SubCase&	subCase = m_subCases[i];
		std::ostringstream name;
		name << s_prefixProgramName << i;
		programCollection.glslSources.add(name.str()) << glu::ComputeSource(genBuiltinVarSource(m_varName, m_varType, subCase.localSize()).c_str());
	}
}